

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O2

void complex_sen(treeNode *tn)

{
  bool bVar1;
  treeNode *ptVar2;
  undefined8 extraout_RAX;
  allocator local_101;
  vector<treeNode*,std::allocator<treeNode*>> *local_100;
  treeNode *sen_BLOCKts;
  treeNode *sen_BLOCKt;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = std::operator==(&sym_abi_cxx11_,"begin");
  if (bVar1) {
    ptVar2 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_90,"begin",(allocator *)&sen_BLOCKt);
    treeNode::treeNode(ptVar2,&local_90);
    local_100 = (vector<treeNode*,std::allocator<treeNode*>> *)&tn->child;
    sen_BLOCKts = ptVar2;
    std::vector<treeNode*,std::allocator<treeNode*>>::emplace_back<treeNode*>
              (local_100,&sen_BLOCKts);
    std::__cxx11::string::~string((string *)&local_90);
    GETSYM_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&sym_abi_cxx11_,(string *)&sen_BLOCKts);
    std::__cxx11::string::~string((string *)&sen_BLOCKts);
    ptVar2 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string
              ((string *)&local_b0,anon_var_dwarf_7f63 + 6,(allocator *)&sen_BLOCKts);
    treeNode::treeNode(ptVar2,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    sen_BLOCKt = ptVar2;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
              ((vector<treeNode_*,_std::allocator<treeNode_*>_> *)local_100,&sen_BLOCKt);
    sen_BLOCK(sen_BLOCKt);
    while( true ) {
      bVar1 = std::operator==(&sym_abi_cxx11_,";");
      if (!bVar1) break;
      ptVar2 = (treeNode *)operator_new(0x38);
      std::__cxx11::string::string((string *)&local_50,";",&local_101);
      treeNode::treeNode(ptVar2,&local_50);
      sen_BLOCKts = ptVar2;
      std::vector<treeNode*,std::allocator<treeNode*>>::emplace_back<treeNode*>
                (local_100,&sen_BLOCKts);
      std::__cxx11::string::~string((string *)&local_50);
      GETSYM_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&sym_abi_cxx11_,(string *)&sen_BLOCKts);
      std::__cxx11::string::~string((string *)&sen_BLOCKts);
      ptVar2 = (treeNode *)operator_new(0x38);
      std::__cxx11::string::string((string *)&local_70,anon_var_dwarf_7f63 + 6,&local_101);
      treeNode::treeNode(ptVar2,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      sen_BLOCKts = ptVar2;
      std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                ((vector<treeNode_*,_std::allocator<treeNode_*>_> *)local_100,
                 (value_type *)&sen_BLOCKts);
      sen_BLOCK(sen_BLOCKts);
    }
    bVar1 = std::operator==(&sym_abi_cxx11_,"end");
    if (!bVar1) {
      error_exc(0x10);
      operator_delete(";",0x38);
      _Unwind_Resume(extraout_RAX);
    }
    ptVar2 = (treeNode *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_d0,"end",&local_101);
    treeNode::treeNode(ptVar2,&local_d0);
    sen_BLOCKts = ptVar2;
    std::vector<treeNode*,std::allocator<treeNode*>>::emplace_back<treeNode*>
              (local_100,&sen_BLOCKts);
    std::__cxx11::string::~string((string *)&local_d0);
    GETSYM_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&sym_abi_cxx11_,(string *)&sen_BLOCKts);
    std::__cxx11::string::~string((string *)&sen_BLOCKts);
  }
  return;
}

Assistant:

void complex_sen(treeNode* tn)
{
    if (sym == "begin") {
        tn->child.push_back(new treeNode("begin"));
        sym = GETSYM();
        auto *sen_BLOCKt = new treeNode("语句");
        tn->child.push_back(sen_BLOCKt);
        sen_BLOCK(sen_BLOCKt);
        while (sym == ";") {
            tn->child.push_back(new treeNode(";"));
            sym = GETSYM();
            auto *sen_BLOCKts = new treeNode("语句");
            tn->child.push_back(sen_BLOCKts);
            sen_BLOCK(sen_BLOCKts);
        }
        if (sym == "end") {
            tn->child.push_back(new treeNode("end"));
            sym = GETSYM();
        }
        else error_exc(complex_end_wrong);           //不是正确的复合语句结束
    } else return;
}